

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O2

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info
          (dwarf_resolver *this,die_object *cu_die,Dwarf_Addr pc,stacktrace_frame *frame)

{
  line_table_info *plVar1;
  Dwarf_Line pDVar2;
  Dwarf_Line line;
  source_location location;
  source_location location_00;
  source_location location_01;
  source_location location_02;
  source_location location_03;
  source_location location_04;
  source_location location_05;
  source_location location_06;
  source_location location_07;
  long lVar3;
  cache_mode cVar4;
  int iVar5;
  skeleton_info *psVar6;
  reference_wrapper<cpptrace::detail::libdwarf::line_table_info> *prVar7;
  __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
  _Var8;
  uint *puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  Dwarf_Line line_00;
  long lVar10;
  optional<cpptrace::detail::libdwarf::skeleton_info,_0> *this_00;
  long lVar11;
  Dwarf_Error error;
  anon_union_8_2_d41c7fdf_for_optional<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O2__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:764:29),_0>_2
  local_c0;
  bool local_b8;
  Dwarf_Error local_b0;
  Dwarf_Addr local_a8;
  stacktrace_frame *local_a0;
  ulong local_98;
  Dwarf_Addr local_90;
  Dwarf_Addr local_88;
  Dwarf_Line local_80;
  Dwarf_Error local_78;
  Dwarf_Signed local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  long local_60;
  long local_58;
  Dwarf_Signed local_50;
  Dwarf_Line *local_48;
  undefined1 local_40 [16];
  
  local_a0 = frame;
  while (*(bool *)((long)this + 0x168) == true) {
    this_00 = (optional<cpptrace::detail::libdwarf::skeleton_info,_0> *)((long)this + 0x148);
    psVar6 = optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(this_00);
    this = psVar6->resolver;
    optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(this_00);
  }
  local_88 = pc;
  get_line_table((dwarf_resolver *)local_40,(die_object *)this);
  if (local_40[8] == true) {
    prVar7 = optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>::
             unwrap((optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>
                     *)local_40);
    plVar1 = prVar7->_M_data;
    cVar4 = get_cache_mode();
    if (cVar4 != prioritize_speed) {
      local_b0 = (Dwarf_Error)0x0;
      local_70 = 0;
      local_48 = (Dwarf_Line *)0x0;
      local_50 = 0;
      error = (Dwarf_Error)0x0;
      iVar5 = dwarf_srclines_two_level_from_linecontext
                        (plVar1->line_context,(Dwarf_Line **)&local_b0,&local_70,&local_48,&local_50
                         ,&error);
      if (iVar5 == 1) {
        handle_dwarf_error(*(Dwarf_Debug *)((long)this + 0x28),error);
      }
      location_02._8_8_ = local_c0;
      location_02.file = (char *)error;
      assert_impl<bool>((detail *)(ulong)(iVar5 == 0),true,0x183cc7,
                        "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                        ,location_02);
      local_68 = &local_a0->filename;
      lVar11 = 1;
      lVar10 = 0;
      local_98 = 0;
      local_80 = (Dwarf_Line)0x0;
      do {
        if (local_70 <= lVar10) {
          return;
        }
        pDVar2 = (Dwarf_Line)(&local_b0->er_errval)[lVar10];
        local_90 = 0;
        error = (Dwarf_Error)0x0;
        iVar5 = dwarf_lineaddr(pDVar2,&local_90,&error);
        if (iVar5 == 1) {
          handle_dwarf_error(*(Dwarf_Debug *)((long)this + 0x28),error);
        }
        location_03._8_8_ = local_c0;
        location_03.file = (char *)error;
        assert_impl<bool>((detail *)(ulong)(iVar5 == 0),true,0x183d55,
                          "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                          ,location_03);
        line_00 = pDVar2;
        lVar3 = lVar11;
        if (local_88 == local_90) {
          for (; local_58 = lVar3, local_60 = lVar10, lVar11 < local_70; lVar11 = lVar11 + 1) {
            line = (Dwarf_Line)(&local_b0->er_errval)[lVar11];
            local_a8 = 0;
            error = (Dwarf_Error)0x0;
            iVar5 = dwarf_lineaddr(line,&local_a8,&error);
            if (iVar5 == 1) {
              handle_dwarf_error(*(Dwarf_Debug *)((long)this + 0x28),error);
            }
            location_04._8_8_ = local_c0;
            location_04.file = (char *)error;
            assert_impl<bool>((detail *)(ulong)(iVar5 == 0),true,0x183d55,
                              "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                              ,location_04);
            if (local_88 == local_a8) {
              line_00 = line;
            }
            lVar10 = local_60;
            lVar3 = local_58;
          }
          lVar10 = local_60;
          lVar11 = local_58;
          if (line_00 != (Dwarf_Line)0x0) goto LAB_00136509;
LAB_00136497:
          error = (Dwarf_Error)0x0;
          iVar5 = dwarf_lineendsequence(pDVar2,(Dwarf_Bool *)&local_a8,&error);
          if (iVar5 == 1) {
            handle_dwarf_error(*(Dwarf_Debug *)((long)this + 0x28),error);
          }
          location_05._8_8_ = local_c0;
          location_05.file = (char *)error;
          assert_impl<bool>((detail *)(ulong)(iVar5 == 0),true,0x183dfa,
                            "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                            ,location_05);
          if ((uint)local_a8 == 0) {
            local_98 = local_90;
            local_80 = pDVar2;
          }
          else {
            local_98 = 0;
            local_80 = (Dwarf_Line)0x0;
          }
        }
        else {
          line_00 = local_80;
          if ((local_88 <= local_98 || local_80 == (Dwarf_Line)0x0) || local_90 <= local_88)
          goto LAB_00136497;
LAB_00136509:
          local_a8 = 0;
          error = (Dwarf_Error)0x0;
          iVar5 = dwarf_lineno(line_00,&local_a8,&error);
          if (iVar5 == 1) {
            handle_dwarf_error(*(Dwarf_Debug *)((long)this + 0x28),error);
          }
          location_06._8_8_ = local_c0;
          location_06.file = (char *)error;
          assert_impl<bool>((detail *)(ulong)(iVar5 == 0),true,0x183d88,
                            "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                            ,location_06);
          (local_a0->line).raw_value = (uint)local_a8;
          local_78 = (Dwarf_Error)0x0;
          error = (Dwarf_Error)0x0;
          iVar5 = dwarf_linesrc(line_00,(char **)&local_78,&error);
          if (iVar5 == 1) {
            handle_dwarf_error(*(Dwarf_Debug *)((long)this + 0x28),error);
          }
          location_07._8_8_ = local_c0;
          location_07.file = (char *)error;
          assert_impl<bool>((detail *)(ulong)(iVar5 == 0),true,0x183dc2,
                            "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                            ,location_07);
          error = local_78;
          local_b8 = true;
          local_c0 = (anon_union_8_2_d41c7fdf_for_optional<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O2__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:764:29),_0>_2
                      )this;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (local_68,(char *)local_78);
          raii_wrapper<char_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:817:29),_0,_0,_0>
          ::~raii_wrapper((raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O2__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:817:29),_0,_0,_0>
                           *)&error);
        }
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + 1;
      } while( true );
    }
    _Var8 = first_less_than_or_equal<__gnu_cxx::__normal_iterator<cpptrace::detail::libdwarf::line_entry*,std::vector<cpptrace::detail::libdwarf::line_entry,std::allocator<cpptrace::detail::libdwarf::line_entry>>>,unsigned_long_long,cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(cpptrace::detail::libdwarf::die_object_const&,unsigned_long_long,cpptrace::stacktrace_frame&)::_lambda(unsigned_long_long,cpptrace::detail::libdwarf::line_entry_const&)_1_>
                      ((plVar1->line_entries).
                       super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (plVar1->line_entries).
                       super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_88);
    if (_Var8._M_current ==
        (plVar1->line_entries).
        super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    pDVar2 = (_Var8._M_current)->line;
    if (((_Var8._M_current)->line_number).holds_value == false) {
      local_b0 = (Dwarf_Error)0x0;
      error = (Dwarf_Error)0x0;
      iVar5 = dwarf_lineno(pDVar2,(Dwarf_Unsigned *)&local_b0,&error);
      if (iVar5 == 1) goto LAB_00136643;
      location._8_8_ = local_c0;
      location.file = (char *)error;
      assert_impl<bool>((detail *)(ulong)(iVar5 == 0),true,0x183bb0,
                        "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                        ,location);
      ((_Var8._M_current)->line_number).field_0.uvalue = (uint)local_b0;
      ((_Var8._M_current)->line_number).holds_value = true;
    }
    puVar9 = optional<unsigned_int,_0>::unwrap(&(_Var8._M_current)->line_number);
    (local_a0->line).raw_value = *puVar9;
    if (((_Var8._M_current)->column_number).holds_value == false) {
      local_b0 = (Dwarf_Error)0x0;
      error = (Dwarf_Error)0x0;
      iVar5 = dwarf_lineoff_b(pDVar2,(Dwarf_Unsigned *)&local_b0,&error);
      if (iVar5 == 1) {
LAB_00136643:
        handle_dwarf_error(*(Dwarf_Debug *)((long)this + 0x28),error);
      }
      location_00._8_8_ = local_c0;
      location_00.file = (char *)error;
      assert_impl<bool>((detail *)(ulong)(iVar5 == 0),true,0x183c5c,
                        "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                        ,location_00);
      ((_Var8._M_current)->column_number).field_0.uvalue = (uint)local_b0;
      ((_Var8._M_current)->column_number).holds_value = true;
    }
    puVar9 = optional<unsigned_int,_0>::unwrap(&(_Var8._M_current)->column_number);
    (local_a0->column).raw_value = *puVar9;
    if (((_Var8._M_current)->path).holds_value == false) {
      local_b0 = (Dwarf_Error)0x0;
      error = (Dwarf_Error)0x0;
      iVar5 = dwarf_linesrc(pDVar2,(char **)&local_b0,&error);
      if (iVar5 == 1) {
        handle_dwarf_error(*(Dwarf_Debug *)((long)this + 0x28),error);
      }
      location_01._8_8_ = local_c0;
      location_01.file = (char *)error;
      assert_impl<bool>((detail *)(ulong)(iVar5 == 0),true,0x183c95,
                        "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                        ,location_01);
      error = local_b0;
      local_b8 = true;
      local_c0 = (anon_union_8_2_d41c7fdf_for_optional<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O2__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:764:29),_0>_2
                  )this;
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
      operator=<char_*&,_0>(&(_Var8._M_current)->path,(char **)&local_b0);
      raii_wrapper<char_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:764:29),_0,_0,_0>
      ::~raii_wrapper((raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O2__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:764:29),_0,_0,_0>
                       *)&error);
    }
    __str = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ::unwrap(&(_Var8._M_current)->path);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_a0->filename,__str);
  }
  return;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        void retrieve_line_info(
            const die_object& cu_die,
            Dwarf_Addr pc,
            stacktrace_frame& frame
        ) {
            // For debug fission the skeleton debug info will have the line table
            if(skeleton) {
                return skeleton.unwrap().resolver.retrieve_line_info(skeleton.unwrap().cu_die, pc, frame);
            }
            auto table_info_opt = get_line_table(cu_die);
            if(!table_info_opt) {
                return; // failing silently for now
            }
            auto& table_info = table_info_opt.unwrap().get();
            if(get_cache_mode() == cache_mode::prioritize_speed) {
                // Lookup in the table
                auto& line_entries = table_info.line_entries;
                auto table_it = first_less_than_or_equal(
                    line_entries.begin(),
                    line_entries.end(),
                    pc,
                    [] (Dwarf_Addr pc, const line_entry& entry) {
                        return pc < entry.low;
                    }
                );
                // If the vector has been empty this can happen
                if(table_it != line_entries.end()) {
                    Dwarf_Line line = table_it->line;
                    // line number
                    if(!table_it->line_number) {
                        Dwarf_Unsigned line_number = 0;
                        VERIFY(wrap(dwarf_lineno, line, &line_number) == DW_DLV_OK);
                        table_it->line_number = static_cast<std::uint32_t>(line_number);
                    }
                    frame.line = table_it->line_number.unwrap();
                    // column number
                    if(!table_it->column_number) {
                        Dwarf_Unsigned column_number = 0;
                        VERIFY(wrap(dwarf_lineoff_b, line, &column_number) == DW_DLV_OK);
                        table_it->column_number = static_cast<std::uint32_t>(column_number);
                    }
                    frame.column = table_it->column_number.unwrap();
                    // filename
                    if(!table_it->path) {
                        char* filename = nullptr;
                        VERIFY(wrap(dwarf_linesrc, line, &filename) == DW_DLV_OK);
                        auto wrapper = raii_wrap(
                            filename,
                            [this] (char* str) { if(str) dwarf_dealloc(dbg, str, DW_DLA_STRING); }
                        );
                        table_it->path = filename;
                    }
                    frame.filename = table_it->path.unwrap();
                }
            } else {
                Dwarf_Line_Context line_context = table_info.line_context;
                // walk for it
                Dwarf_Line* line_buffer = nullptr;
                Dwarf_Signed line_count = 0;
                Dwarf_Line* linebuf_actuals = nullptr;
                Dwarf_Signed linecount_actuals = 0;
                VERIFY(
                    wrap(
                        dwarf_srclines_two_level_from_linecontext,
                        line_context,
                        &line_buffer,
                        &line_count,
                        &linebuf_actuals,
                        &linecount_actuals
                    ) == DW_DLV_OK
                );
                Dwarf_Addr last_lineaddr = 0;
                Dwarf_Line last_line = nullptr;
                for(int i = 0; i < line_count; i++) {
                    Dwarf_Line line = line_buffer[i];
                    Dwarf_Addr lineaddr = 0;
                    VERIFY(wrap(dwarf_lineaddr, line, &lineaddr) == DW_DLV_OK);
                    Dwarf_Line found_line = nullptr;
                    if(pc == lineaddr) {
                        // Multiple PCs may correspond to a line, find the last one
                        found_line = line;
                        for(int j = i + 1; j < line_count; j++) {
                            Dwarf_Line line = line_buffer[j];
                            Dwarf_Addr lineaddr = 0;
                            VERIFY(wrap(dwarf_lineaddr, line, &lineaddr) == DW_DLV_OK);
                            if(pc == lineaddr) {
                                found_line = line;
                            }
                        }
                    } else if(last_line && pc > last_lineaddr && pc < lineaddr) {
                        // Guess that the last line had it
                        found_line = last_line;
                    }
                    if(found_line) {
                        Dwarf_Unsigned line_number = 0;
                        VERIFY(wrap(dwarf_lineno, found_line, &line_number) == DW_DLV_OK);
                        frame.line = static_cast<std::uint32_t>(line_number);
                        char* filename = nullptr;
                        VERIFY(wrap(dwarf_linesrc, found_line, &filename) == DW_DLV_OK);
                        auto wrapper = raii_wrap(
                            filename,
                            [this] (char* str) { if(str) dwarf_dealloc(dbg, str, DW_DLA_STRING); }
                        );
                        frame.filename = filename;
                    } else {
                        Dwarf_Bool is_line_end;
                        VERIFY(wrap(dwarf_lineendsequence, line, &is_line_end) == DW_DLV_OK);
                        if(is_line_end) {
                            last_lineaddr = 0;
                            last_line = nullptr;
                        } else {
                            last_lineaddr = lineaddr;
                            last_line = line;
                        }
                    }
                }
            }
        }